

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::add_torrent_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,add_torrent_alert *this)

{
  element_type *peVar1;
  error_category *peVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *in_RCX;
  char *pcVar5;
  span<const_char> in;
  char info_hash [41];
  char msg [600];
  string local_2e8;
  string local_2c8;
  char local_2a8 [48];
  char local_278 [600];
  
  peVar1 = (this->params).ti.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if ((this->params).name._M_string_length == 0) {
      if ((this->params).url._M_string_length == 0) {
        pcVar5 = local_2a8;
        in.m_len = (difference_type)pcVar5;
        in.m_ptr = (char *)0x14;
        aux::to_hex((aux *)&(this->params).info_hash,in,in_RCX);
      }
      else {
        pcVar5 = (this->params).url._M_dataplus._M_p;
      }
    }
    else {
      pcVar5 = (this->params).name._M_dataplus._M_p;
    }
  }
  else {
    pcVar5 = (peVar1->m_files).m_name._M_dataplus._M_p;
  }
  if ((this->error).failed_ == true) {
    iVar3 = (**((this->error).cat_)->_vptr_error_category)();
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(&local_2e8,peVar2,(ulong)(uint)(this->error).val_);
    convert_from_native(&local_2c8,&local_2e8);
    snprintf(local_278,600,"failed to add torrent \"%s\": [%s] %s",pcVar5,
             CONCAT44(extraout_var,iVar3),local_2c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    snprintf(local_278,600,"added torrent: %s",pcVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(local_278);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_278,local_278 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string add_torrent_alert::message() const
	{
		char msg[600];
		char info_hash[41];
		char const* torrent_name = info_hash;
		if (params.ti) torrent_name = params.ti->name().c_str();
		else if (!params.name.empty()) torrent_name = params.name.c_str();
#if TORRENT_ABI_VERSION == 1
		else if (!params.url.empty()) torrent_name = params.url.c_str();
#endif
		else aux::to_hex(params.info_hash, info_hash);

		if (error)
		{
			std::snprintf(msg, sizeof(msg), "failed to add torrent \"%s\": [%s] %s"
				, torrent_name, error.category().name()
				, convert_from_native(error.message()).c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "added torrent: %s", torrent_name);
		}
		return msg;
	}